

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.cpp
# Opt level: O3

Request * __thiscall
Post::PostFixture::parse(Request *__return_storage_ptr__,PostFixture *this,char *s,size_t size)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  size_type *psVar4;
  ParseResult PVar5;
  undefined1 local_e8 [8];
  HttpRequestParser parser;
  Request request;
  
  psVar3 = &request.method._M_string_length;
  request.method._M_dataplus._M_p = (pointer)0x0;
  request.method._M_string_length._0_1_ = 0;
  psVar1 = &request.uri._M_string_length;
  request.uri._M_dataplus._M_p = (pointer)0x0;
  request.uri._M_string_length._0_1_ = 0;
  request.uri.field_2._8_8_ = 0;
  request.versionMajor = 0;
  request.versionMinor = 0;
  request.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  request.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  request.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0;
  request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._1_7_ = 0;
  request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = false;
  psVar4 = &parser.chunkSizeStr._M_string_length;
  local_e8._0_4_ = RequestMethodStart;
  parser.state = RequestMethodStart;
  parser._4_4_ = 0;
  parser.chunkSizeStr._M_dataplus._M_p = (pointer)0x0;
  parser.chunkSizeStr._M_string_length._0_1_ = 0;
  parser.chunkSizeStr.field_2._8_8_ = 0;
  parser.chunkSize._0_1_ = 0;
  parser.contentSize = (size_t)psVar4;
  parser._56_8_ = psVar3;
  request.method.field_2._8_8_ = psVar1;
  PVar5 = httpparser::HttpRequestParser::consume
                    ((HttpRequestParser *)local_e8,(Request *)&parser.chunked,s,s + size);
  paVar2 = &(__return_storage_ptr__->method).field_2;
  (__return_storage_ptr__->method)._M_dataplus._M_p = (pointer)paVar2;
  if (PVar5 == ParsingCompleted) {
    if ((size_type *)parser._56_8_ == psVar3) {
      paVar2->_M_allocated_capacity =
           CONCAT71(request.method._M_string_length._1_7_,
                    (undefined1)request.method._M_string_length);
      *(size_type *)((long)&(__return_storage_ptr__->method).field_2 + 8) =
           request.method.field_2._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->method)._M_dataplus._M_p = (pointer)parser._56_8_;
      (__return_storage_ptr__->method).field_2._M_allocated_capacity =
           CONCAT71(request.method._M_string_length._1_7_,
                    (undefined1)request.method._M_string_length);
    }
    (__return_storage_ptr__->method)._M_string_length = (size_type)request.method._M_dataplus._M_p;
    request.method._M_dataplus._M_p = (pointer)0x0;
    request.method._M_string_length._0_1_ = 0;
    paVar2 = &(__return_storage_ptr__->uri).field_2;
    (__return_storage_ptr__->uri)._M_dataplus._M_p = (pointer)paVar2;
    if ((size_type *)request.method.field_2._8_8_ == psVar1) {
      paVar2->_M_allocated_capacity =
           CONCAT71(request.uri._M_string_length._1_7_,(undefined1)request.uri._M_string_length);
      *(size_type *)((long)&(__return_storage_ptr__->uri).field_2 + 8) =
           request.uri.field_2._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->uri)._M_dataplus._M_p = (pointer)request.method.field_2._8_8_;
      (__return_storage_ptr__->uri).field_2._M_allocated_capacity =
           CONCAT71(request.uri._M_string_length._1_7_,(undefined1)request.uri._M_string_length);
    }
    (__return_storage_ptr__->uri)._M_string_length = (size_type)request.uri._M_dataplus._M_p;
    request.uri._M_dataplus._M_p = (pointer)0x0;
    request.uri._M_string_length._0_1_ = 0;
    __return_storage_ptr__->versionMajor = request.uri.field_2._8_4_;
    __return_storage_ptr__->versionMinor = request.uri.field_2._12_4_;
    (__return_storage_ptr__->headers).
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)request._64_8_;
    (__return_storage_ptr__->headers).
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         request.headers.
         super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->headers).
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         request.headers.
         super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    request.headers.
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    request.versionMajor = 0;
    request.versionMinor = 0;
    request.headers.
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)request.headers.
                  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start._0_1_);
    (__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT71(request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish._1_7_,
                           request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish._0_1_);
    request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish._1_7_ = 0;
    request.headers.
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = 0;
    request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start._1_7_ = 0;
    __return_storage_ptr__->keepAlive =
         (bool)request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._0_1_;
    parser._56_8_ = psVar3;
    request.method.field_2._8_8_ = psVar1;
  }
  else {
    (__return_storage_ptr__->method)._M_string_length = 0;
    (__return_storage_ptr__->method).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->uri)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->uri).field_2
    ;
    (__return_storage_ptr__->uri)._M_string_length = 0;
    (__return_storage_ptr__->uri).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->versionMajor = 0;
    __return_storage_ptr__->versionMinor = 0;
    (__return_storage_ptr__->headers).
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->headers).
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->headers).
    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->content).super__Vector_base<char,_std::allocator<char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  }
  if ((size_type *)parser.contentSize != psVar4) {
    operator_delete((void *)parser.contentSize,
                    CONCAT71(parser.chunkSizeStr._M_string_length._1_7_,
                             (undefined1)parser.chunkSizeStr._M_string_length) + 1);
  }
  if (request.headers.
      super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(request.headers.
                    super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    CONCAT71(request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_finish._1_7_,
                             request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_finish._0_1_) -
                    (long)request.headers.
                          super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>::
  ~vector((vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
           *)&request.versionMajor);
  if ((size_type *)request.method.field_2._8_8_ != psVar1) {
    operator_delete((void *)request.method.field_2._8_8_,
                    CONCAT71(request.uri._M_string_length._1_7_,
                             (undefined1)request.uri._M_string_length) + 1);
  }
  if ((size_type *)parser._56_8_ != psVar3) {
    operator_delete((void *)parser._56_8_,
                    CONCAT71(request.method._M_string_length._1_7_,
                             (undefined1)request.method._M_string_length) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Request parse(const char *s, size_t size)
    {
        Request request;
        HttpRequestParser parser;
        
        HttpRequestParser::ParseResult res = parser.parse(request, s, s + size);
        
        if( res != HttpRequestParser::ParsingCompleted )
            return Request();
        else
            return request;
    }